

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

Expression *
slang::ast::MinTypMaxExpression::fromSyntax
          (Compilation *compilation,MinTypMaxExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  MinTypMax MVar1;
  ExpressionSyntax *pEVar2;
  Type *args;
  Expression *pEVar3;
  bool bVar4;
  ulong uVar5;
  Expression *args_1;
  Expression *args_2;
  Expression *args_3;
  MinTypMaxExpression *expr;
  bitmask<slang::ast::ASTFlags> extraFlags;
  char *func;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  Expression *selected;
  Expression *local_50;
  bitmask<slang::ast::ASTFlags> local_48;
  SourceRange local_40;
  
  uVar5 = (ulong)(compilation->options).minTypMax;
  local_48.m_bits = 2;
  extraFlags_00.m_bits = 2;
  extraFlags.m_bits = 2;
  if (uVar5 < 3) {
    local_48.m_bits = *(underlying_type *)(&DAT_0041a430 + uVar5 * 8);
    extraFlags_00.m_bits = *(underlying_type *)(&DAT_0041a448 + uVar5 * 8);
    extraFlags.m_bits = *(underlying_type *)(&DAT_0041a460 + uVar5 * 8);
  }
  pEVar2 = (syntax->min).ptr;
  if (pEVar2 != (ExpressionSyntax *)0x0) {
    args_1 = Expression::create(compilation,pEVar2,context,extraFlags,assignmentTarget);
    pEVar2 = (syntax->typ).ptr;
    if (pEVar2 != (ExpressionSyntax *)0x0) {
      args_2 = Expression::create(compilation,pEVar2,context,extraFlags_00,assignmentTarget);
      pEVar2 = (syntax->max).ptr;
      if (pEVar2 != (ExpressionSyntax *)0x0) {
        args_3 = Expression::create(compilation,pEVar2,context,local_48,assignmentTarget);
        local_50 = (Expression *)0x0;
        MVar1 = (compilation->options).minTypMax;
        pEVar3 = args_3;
        if (((MVar1 != Max) && (pEVar3 = args_2, MVar1 != Typ)) && (pEVar3 = local_50, MVar1 == Min)
           ) {
          pEVar3 = args_1;
        }
        local_50 = pEVar3;
        args = (local_50->type).ptr;
        if (args != (Type *)0x0) {
          local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          expr = BumpAllocator::
                 emplace<slang::ast::MinTypMaxExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression*&,slang::SourceRange>
                           (&compilation->super_BumpAllocator,args,args_1,args_2,args_3,&local_50,
                            &local_40);
          bVar4 = Expression::bad(args_1);
          if (((bVar4) || (bVar4 = Expression::bad(args_2), bVar4)) ||
             (bVar4 = Expression::bad(args_3), bVar4)) {
            expr = (MinTypMaxExpression *)Expression::badExpr(compilation,&expr->super_Expression);
          }
          return &expr->super_Expression;
        }
        func = 
        "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
        goto LAB_003a415c;
      }
    }
  }
  func = 
  "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
  ;
LAB_003a415c:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Expression& MinTypMaxExpression::fromSyntax(Compilation& compilation,
                                            const MinTypMaxExpressionSyntax& syntax,
                                            const ASTContext& context,
                                            const Type* assignmentTarget) {
    // Only one of the expressions will be considered evaluated.
    auto minFlags = ASTFlags::UnevaluatedBranch;
    auto typFlags = ASTFlags::UnevaluatedBranch;
    auto maxFlags = ASTFlags::UnevaluatedBranch;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            minFlags = ASTFlags::None;
            break;
        case MinTypMax::Typ:
            typFlags = ASTFlags::None;
            break;
        case MinTypMax::Max:
            maxFlags = ASTFlags::None;
            break;
    }

    auto& min = create(compilation, *syntax.min, context, minFlags, assignmentTarget);
    auto& typ = create(compilation, *syntax.typ, context, typFlags, assignmentTarget);
    auto& max = create(compilation, *syntax.max, context, maxFlags, assignmentTarget);

    Expression* selected = nullptr;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            selected = &min;
            break;
        case MinTypMax::Typ:
            selected = &typ;
            break;
        case MinTypMax::Max:
            selected = &max;
            break;
    }

    auto result = compilation.emplace<MinTypMaxExpression>(*selected->type, min, typ, max, selected,
                                                           syntax.sourceRange());
    if (min.bad() || typ.bad() || max.bad())
        return badExpr(compilation, result);

    return *result;
}